

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O2

void __thiscall Debugger::DoLogMessage(Debugger *this,shared_ptr<BreakPoint> *bp)

{
  char cVar1;
  uint uVar2;
  _Alloc_hider _Var3;
  pointer pLVar4;
  bool bVar5;
  int iVar6;
  string *psVar7;
  Variable *pVVar8;
  string *psVar9;
  EmmyFacade *this_00;
  ulong uVar10;
  long lVar11;
  long lVar12;
  shared_ptr<BreakPoint> *psVar13;
  string baseName;
  size_t rightBraceBegin;
  size_t leftBraceBegin;
  shared_ptr<BreakPoint> *local_218;
  element_type *local_210;
  vector<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_> replaceExpresses;
  string local_1e8;
  undefined7 uStack_1e7;
  __shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2> local_1c8;
  stringstream message;
  ostream local_1a8 [376];
  
  local_210 = (bp->super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  psVar7 = &local_210->logMessage;
  replaceExpresses.
  super__Vector_base<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  leftBraceBegin = 0;
  rightBraceBegin = 0;
  replaceExpresses.
  super__Vector_base<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  replaceExpresses.
  super__Vector_base<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  baseName._M_dataplus._M_p = (pointer)0x0;
  lVar11 = 0;
  iVar6 = 0;
  local_218 = bp;
  do {
    if (baseName._M_dataplus._M_p == (pointer)(local_210->logMessage)._M_string_length) {
      std::__cxx11::stringstream::stringstream((stringstream *)&message);
      if (replaceExpresses.
          super__Vector_base<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          replaceExpresses.
          super__Vector_base<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        std::operator<<(local_1a8,(string *)psVar7);
        psVar13 = local_218;
      }
      else {
        lVar11 = 0;
        uVar10 = 0;
        for (lVar12 = 0;
            pLVar4 = replaceExpresses.
                     super__Vector_base<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>
                     ._M_impl.super__Vector_impl_data._M_start, psVar13 = local_218,
            lVar12 != ((long)replaceExpresses.
                             super__Vector_base<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)replaceExpresses.
                            super__Vector_base<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x38; lVar12 = lVar12 + 1)
        {
          if (uVar10 < *(ulong *)((long)&(replaceExpresses.
                                          super__Vector_base<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->StartIndex +
                                 lVar11)) {
            std::__cxx11::string::substr((ulong)&baseName,(ulong)psVar7);
            std::operator<<(local_1a8,(string *)&baseName);
            std::__cxx11::string::~string((string *)&baseName);
          }
          psVar9 = (string *)((long)&(pLVar4->Expr)._M_dataplus._M_p + lVar11);
          if ((&pLVar4->NeedEval)[lVar11] == true) {
            std::make_shared<EvalContext>();
            std::__cxx11::string::operator=((string *)(baseName._M_dataplus._M_p + 8),psVar9);
            baseName._M_dataplus._M_p[0x70] = '\x01';
            baseName._M_dataplus._M_p[0x71] = '\0';
            baseName._M_dataplus._M_p[0x72] = '\0';
            baseName._M_dataplus._M_p[0x73] = '\0';
            std::__shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_1c8,(__shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2> *)&baseName
                      );
            bVar5 = DoEval(this,(shared_ptr<EvalContext> *)&local_1c8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c8._M_refcount)
            ;
            if (bVar5) {
              pVVar8 = Idx<Variable>::operator->
                                 ((Idx<Variable> *)(baseName._M_dataplus._M_p + 0x78));
              psVar9 = (string *)&pVVar8->value;
            }
            else {
              psVar9 = (string *)(baseName._M_dataplus._M_p + 0x48);
            }
            std::operator<<(local_1a8,psVar9);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&baseName._M_string_length);
          }
          else {
            std::operator<<(local_1a8,psVar9);
          }
          uVar10 = *(long *)((long)&pLVar4->EndIndex + lVar11) + 1;
          lVar11 = lVar11 + 0x38;
        }
        if (uVar10 < (local_210->logMessage)._M_string_length) {
          std::__cxx11::string::substr((ulong)&baseName,(ulong)psVar7);
          std::operator<<(local_1a8,(string *)&baseName);
          std::__cxx11::string::~string((string *)&baseName);
        }
      }
      BaseName(&baseName,
               &((psVar13->super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->file
              );
      this_00 = EmmyFacade::Get();
      _Var3 = baseName._M_dataplus;
      uVar2 = ((psVar13->super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->line;
      std::__cxx11::stringbuf::str();
      EmmyFacade::SendLog(this_00,Info,"[%s:%d] %s",_Var3._M_p,(ulong)uVar2,
                          CONCAT71(uStack_1e7,local_1e8));
      std::__cxx11::string::~string(&local_1e8);
      std::__cxx11::string::~string((string *)&baseName);
      std::__cxx11::stringstream::~stringstream((stringstream *)&message);
      std::vector<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>::~vector
                (&replaceExpresses);
      return;
    }
    cVar1 = baseName._M_dataplus._M_p[(long)(psVar7->_M_dataplus)._M_p];
    if (iVar6 == 2) {
      if ((cVar1 == '}') && (baseName._M_dataplus._M_p == (pointer)(rightBraceBegin + 1))) {
        message = (stringstream)0x0;
        std::vector<LogMessageReplaceExpress,std::allocator<LogMessageReplaceExpress>>::
        emplace_back<char_const(&)[2],unsigned_long&,unsigned_long&,bool>
                  ((vector<LogMessageReplaceExpress,std::allocator<LogMessageReplaceExpress>> *)
                   &replaceExpresses,(char (*) [2])0x1732b1,&rightBraceBegin,
                   (unsigned_long *)&baseName,(bool *)&message);
      }
      else {
        baseName._M_dataplus._M_p = baseName._M_dataplus._M_p + -1;
      }
LAB_00157a70:
      iVar6 = 0;
    }
    else if (iVar6 == 1) {
      if (cVar1 == '}') {
        if (lVar11 == 0) {
          std::__cxx11::string::substr((ulong)&message,(ulong)psVar7);
          local_1e8 = (string)0x1;
          std::vector<LogMessageReplaceExpress,std::allocator<LogMessageReplaceExpress>>::
          emplace_back<std::__cxx11::string,unsigned_long&,unsigned_long&,bool>
                    ((vector<LogMessageReplaceExpress,std::allocator<LogMessageReplaceExpress>> *)
                     &replaceExpresses,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&message,
                     &leftBraceBegin,(unsigned_long *)&baseName,(bool *)&local_1e8);
          std::__cxx11::string::~string((string *)&message);
          lVar11 = 0;
          goto LAB_00157a70;
        }
        lVar11 = lVar11 + -1;
      }
      else if (cVar1 == '{') {
        if (baseName._M_dataplus._M_p == (pointer)(leftBraceBegin + 1)) {
          message = (stringstream)0x0;
          std::vector<LogMessageReplaceExpress,std::allocator<LogMessageReplaceExpress>>::
          emplace_back<char_const(&)[2],unsigned_long&,unsigned_long&,bool>
                    ((vector<LogMessageReplaceExpress,std::allocator<LogMessageReplaceExpress>> *)
                     &replaceExpresses,(char (*) [2])"{",&leftBraceBegin,(unsigned_long *)&baseName,
                     (bool *)&message);
          goto LAB_00157a70;
        }
        lVar11 = lVar11 + 1;
      }
LAB_00157a8b:
      iVar6 = 1;
    }
    else if (cVar1 == '}') {
      iVar6 = 2;
      rightBraceBegin = (size_t)baseName._M_dataplus._M_p;
    }
    else {
      iVar6 = 0;
      if (cVar1 == '{') {
        lVar11 = 0;
        leftBraceBegin = (size_t)baseName._M_dataplus._M_p;
        goto LAB_00157a8b;
      }
    }
    baseName._M_dataplus._M_p = baseName._M_dataplus._M_p + 1;
  } while( true );
}

Assistant:

void Debugger::DoLogMessage(std::shared_ptr<BreakPoint> bp) {
	std::string &logMessage = bp->logMessage;
	// 为什么不用regex?
	// 因为gcc 4.8 regex还是空实现
	// 而且后续版本的gcc中正则表达式行为似乎也不太正常
	enum class ParseState {
		Normal,
		LeftBrace,
		RightBrace
	} state = ParseState::Normal;

	std::vector<LogMessageReplaceExpress> replaceExpresses;


	std::size_t leftBraceBegin = 0;

	std::size_t rightBraceBegin = 0;

	// 如果在表达式中出现左大括号
	std::size_t exprLeftCount = 0;


	for (std::size_t index = 0; index != logMessage.size(); index++) {
		char ch = logMessage[index];

		switch (state) {
			case ParseState::Normal: {
				if (ch == '{') {
					state = ParseState::LeftBrace;
					leftBraceBegin = index;
					exprLeftCount = 0;
				} else if (ch == '}') {
					state = ParseState::RightBrace;
					rightBraceBegin = index;
				}
				break;
			}
			case ParseState::LeftBrace: {
				if (ch == '{') {
					// 认为是左双大括号转义为可见的'{'
					if (index == leftBraceBegin + 1) {
						replaceExpresses.emplace_back("{", leftBraceBegin, index, false);
						state = ParseState::Normal;
					} else {
						exprLeftCount++;
					}
				} else if (ch == '}') {
					// 认为是表达式内的大括号
					if (exprLeftCount > 0) {
						exprLeftCount--;
						continue;
					}

					replaceExpresses.emplace_back(logMessage.substr(leftBraceBegin + 1, index - leftBraceBegin - 1),
					                              leftBraceBegin, index, true);


					state = ParseState::Normal;
				}
				break;
			}
			case ParseState::RightBrace: {
				if (ch == '}' && (index == rightBraceBegin + 1)) {
					replaceExpresses.emplace_back("}", rightBraceBegin, index, false);
				} else {
					//认为左右大括号失配，之前的不做处理，退格一位回去重新判断
					index--;
				}
				state = ParseState::Normal;
				break;
			}
		}
	}

	std::stringstream message;

	if (replaceExpresses.empty()) {
		message << logMessage;
	} else {
		// 拼接字符串
		// 怎么replace 函数都没有啊

		std::size_t start = 0;
		for (std::size_t index = 0; index != replaceExpresses.size(); index++) {
			auto &replaceExpress = replaceExpresses[index];
			if (start < replaceExpress.StartIndex) {
				auto fragment = logMessage.substr(start, replaceExpress.StartIndex - start);
				message << fragment;
				start = replaceExpress.StartIndex;
			}

			if (replaceExpress.NeedEval) {
				auto ctx = std::make_shared<EvalContext>();
				ctx->expr = std::move(replaceExpress.Expr);
				ctx->depth = 1;
				bool succeed = DoEval(ctx);
				if (succeed) {
					message << ctx->result->value;
				} else {
					message << ctx->error;
				}
			} else {
				message << replaceExpress.Expr;
			}

			start = replaceExpress.EndIndex + 1;
		}

		if (start < logMessage.size()) {
			auto fragment = logMessage.substr(start, logMessage.size() - start);
			message << fragment;
		}
	}

	std::string baseName = BaseName(bp->file);

	EmmyFacade::Get().SendLog(LogType::Info, "[%s:%d] %s", baseName.c_str(), bp->line, message.str().c_str());
}